

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.c
# Opt level: O2

int main(void)

{
  uint uVar1;
  int iVar2;
  sub_t sub;
  char *syntax_error;
  ztloader_t *loaders [1];
  ztsaver_t *savers [1];
  ztregion_t regions [1];
  example_t example;
  
  regions[0].spec.base = malloc(10);
  if (regions[0].spec.base == (void *)0x0) {
    iVar2 = 1;
  }
  else {
    example.integer = 0x2a;
    example.pointer_to_integer = &pointed_at;
    example.integer_array[0] = 0x3d;
    example.integer_array[1] = 0x3e;
    example.integer_array[2] = 0x3f;
    example.inline_sub.value = '+';
    example.array_of_sub[0].value = ',';
    example.array_of_sub[1].value = '-';
    example.array_of_sub[2].value = '.';
    example.static_pointer = "B";
    example.static_nullpointer = (char *)0x0;
    example.pointer = (char *)((long)regions[0].spec.base + 5);
    example.nullpointer = (char *)0x0;
    sub.value = '3';
    example.string_in_array = "Ringo";
    regions[0].id = "some array";
    regions[0].spec.length = 10;
    regions[0].spec.nelems = 10;
    savers[0] = bandmember_saver;
    example.pointer_to_sub = &sub;
    uVar1 = zt_save(&example_meta,&example,"demo.zt",regions,1,savers,1);
    if (uVar1 == 0) {
      example.integer = 0x55555555;
      example._4_4_ = 0x55555555;
      example.array_of_sub[0].value = 'U';
      example.array_of_sub[1].value = 'U';
      example.array_of_sub[2].value = 'U';
      example._43_5_ = 0x5555555555;
      example.string_in_array = (char *)0x5555555555555555;
      example.pointer = (char *)0x5555555555555555;
      example.nullpointer = (char *)0x5555555555555555;
      example.static_pointer = (char *)0x5555555555555555;
      example.static_nullpointer = (char *)0x5555555555555555;
      example.integer_array[0] = 0x55555555;
      example.integer_array[1] = 0x55555555;
      example.integer_array[2] = 0x55555555;
      example.inline_sub.value = 'U';
      example._29_3_ = 0x555555;
      example.pointer_to_integer = &pointed_at;
      loaders[0] = bandmember_loader;
      example.pointer_to_sub = &sub;
      uVar1 = zt_load(&example_meta,&example,"demo.zt",regions,1,loaders,1,&syntax_error);
      iVar2 = 0;
      if ((uVar1 != 0) &&
         (fprintf(_stderr,"zt_load failed (%d)\n",(ulong)uVar1), iVar2 = 1,
         syntax_error != (char *)0x0)) {
        fprintf(_stderr,"syntax error: %s\n");
        zt_freesyntax(syntax_error);
      }
    }
    else {
      fprintf(_stderr,"zt_save failed (%d)\n",(ulong)uVar1);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int main(void)
{
#ifdef __riscos
  static const char testfile[] = "demo_zt";
#else
  static const char testfile[] = "demo.zt";
#endif

  ztresult_t  rc;
  char       *tenbyte;
  example_t   example;
  ztregion_t  regions[1]; /* descriptions of heap blocks */
  sub_t       sub;
  ztsaver_t  *savers[1];
  ztloader_t *loaders[1];
  char       *syntax_error;

  tenbyte = malloc(10);
  if (tenbyte == NULL)
    return EXIT_FAILURE;

  sub.value = 51;

  example.integer               = 42;
  example.pointer_to_integer    = &pointed_at;
  example.integer_array[0]      = 61;
  example.integer_array[1]      = 62;
  example.integer_array[2]      = 63;
  example.inline_sub.value      = 43;
  example.pointer_to_sub        = &sub;
  example.array_of_sub[0].value = 44;
  example.array_of_sub[1].value = 45;
  example.array_of_sub[2].value = 46;
  example.static_pointer        = &example_array[2];
  example.static_nullpointer     = NULL;
  example.pointer               = &tenbyte[5];
  example.nullpointer            = NULL;
  example.string_in_array       = popular_beat_combo[3];

  regions[0].id                 = tenbyte_id;
  regions[0].spec.base          = tenbyte;
  regions[0].spec.length        = 10;
  regions[0].spec.nelems        = 10;

  savers[CUSTOMTYPE_BAND_MEMBER] = bandmember_saver;
  rc = zt_save(&example_meta,
               &example,
                testfile,
               &regions[0],
                NELEMS(regions),
                savers,
                NELEMS(savers));
  if (rc != ztresult_OK)
  {
    fprintf(stderr, "zt_save failed (%d)\n", rc);
    return EXIT_FAILURE;
  }

  /* Setup the example structure layout (but not the values themselves) */
  memset(&example, 0x55, sizeof(example_t));
  example.pointer_to_integer    = &pointed_at;
  example.pointer_to_sub        = &sub;

  loaders[CUSTOMTYPE_BAND_MEMBER] = bandmember_loader;
  rc = zt_load(&example_meta,
               &example,
                testfile,
               &regions[0],
                NELEMS(regions),
                loaders,
               NELEMS(loaders),
               &syntax_error);
  if (rc != ztresult_OK)
  {
    fprintf(stderr, "zt_load failed (%d)\n", rc);
    if (syntax_error)
    {
      fprintf(stderr, "syntax error: %s\n", syntax_error);
      zt_freesyntax(syntax_error);
    }
    return EXIT_FAILURE;
  }

  assert(example.integer == 42);
  assert(pointed_at == 33);
  assert(example.integer_array[0] == 61);
  assert(example.integer_array[1] == 62);
  assert(example.integer_array[2] == 63);
  assert(example.inline_sub.value == 43);
  assert(example.pointer_to_sub->value == 51);
  assert(example.array_of_sub[0].value == 44);
  assert(example.array_of_sub[1].value == 45);
  assert(example.array_of_sub[2].value == 46);
  assert(example.static_pointer == &example_array[2]);
  assert(example.static_nullpointer == NULL);
  assert(example.pointer == &tenbyte[5]);
  assert(example.nullpointer == NULL);
  assert(example.string_in_array == popular_beat_combo[3]);

  return EXIT_SUCCESS;
}